

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_ild.c
# Opt level: O1

int prefix_evex(pt_ild *ild,uint8_t length,uint8_t rex)

{
  byte bVar1;
  byte bVar2;
  uint8_t *puVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  
  if (ild == (pt_ild *)0x0) {
    return -1;
  }
  bVar1 = ild->max_bytes;
  uVar6 = length + 1;
  if (bVar1 <= uVar6) {
    return -0xe;
  }
  puVar3 = ild->itext;
  bVar2 = puVar3[uVar6 & 0xff];
  if ((ild->mode != ptem_64bit) && (bVar2 < 0xc0)) {
    iVar5 = opcode_dec(ild,length);
    return iVar5;
  }
  uVar6 = length + 5;
  if (bVar1 <= uVar6 && uVar6 != bVar1) {
    return -0xe;
  }
  bVar1 = puVar3[length + 2 & 0xff];
  ild->vex = '\x02';
  uVar4 = ((ushort)*(undefined4 *)&ild->field_0x10 & 0xfc7f |
          (ushort)((~(uint)bVar2 >> 3 & 2 | (uint)(-1 < (char)bVar2)) << 7)) + (bVar1 & 0xff80) * 4;
  *(ushort *)&ild->field_0x10 = uVar4;
  switch(bVar1 & 3) {
  case 0:
    goto switchD_0010a187_caseD_0;
  case 1:
    uVar4 = uVar4 | 1;
    break;
  case 2:
    uVar4 = uVar4 | 0x68;
    break;
  case 3:
    uVar4 = uVar4 & 0xff8f | 0x50;
  }
  *(ushort *)&ild->field_0x10 = uVar4;
switchD_0010a187_caseD_0:
  ild->map = bVar2 & 7;
  ild->nominal_opcode = puVar3[length + 4 & 0xff];
  iVar5 = modrm_dec(ild,length + '\x05');
  return iVar5;
}

Assistant:

static int prefix_evex(struct pt_ild *ild, uint8_t length, uint8_t rex)
{
	uint8_t max_bytes;
	uint8_t p1, p2, map;

	(void) rex;

	if (!ild)
		return -pte_internal;

	max_bytes = ild->max_bytes;

	/* Read the next byte to validate that this is indeed EVEX. */
	if (max_bytes <= (length + 1))
		return -pte_bad_insn;

	p1 = get_byte(ild, length + 1);

	/* If p1[7:6] is not 11b in non-64-bit mode, this is BOUND, not EVEX. */
	if (!mode_64b(ild) && !bits_match(p1, 0xc0, 0xc0))
		return opcode_dec(ild, length);

	/* We need at least 5 bytes
	 * - 4 for the EVEX prefix and payload and
	 * - 1 for the opcode.
	 */
	if (max_bytes < (length + 5))
		return -pte_bad_insn;

	p2 = get_byte(ild, length + 2);

	ild->vex = 2;
	ild->rex_r = ((~p1 >> 7) & 0x01) | ((~p1 >> 3) & 0x02);
	ild->rex_w = (p2 >> 7) & 0x01;

	resolve_vex_pp(ild, p2 & 0x03);

	ild->map = map = p1 & 0x07;

	/* Eat the EVEX. */
	length += 4;
	return prefix_vex_done(ild, length);
}